

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O3

void Cec_ManPatSavePattern(Cec_ManPat_t *pMan,Cec_ManSat_t *p,Gia_Obj_t *pObj)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  Vec_Int_t *vPat;
  timespec ts;
  timespec local_40;
  
  iVar7 = clock_gettime(3,&local_40);
  if (iVar7 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (((int)(uint)*(undefined8 *)pObj < 0) &&
     (((uint)*(undefined8 *)pObj & 0x1fffffff) != 0x1fffffff)) {
    uVar1 = pMan->nPats;
    uVar4 = pMan->nPatsAll;
    pMan->nPats = uVar1 + 1;
    pMan->nPatsAll = uVar4 + 1;
    Gia_ManIncrementTravId(p->pAig);
    iVar7 = Cec_ManPatComputePattern_rec(p,p->pAig,pObj + -(*(ulong *)pObj & 0x1fffffff));
    if ((((uint)(*(ulong *)pObj >> 0x1d) & 7 ^
         (uint)((ulong)*(undefined8 *)(pObj + -(*(ulong *)pObj & 0x1fffffff)) >> 0x3e)) & 1) != 0) {
      uVar2 = pMan->nPatLits;
      uVar5 = pMan->nPatLitsAll;
      pMan->nPatLits = iVar7 + uVar2;
      pMan->nPatLitsAll = iVar7 + uVar5;
      pMan->vPattern1->nSize = 0;
      Gia_ManIncrementTravId(p->pAig);
      Cec_ManPatComputePattern1_rec(p->pAig,pObj + -(*(ulong *)pObj & 0x1fffffff),pMan->vPattern1);
      pMan->vPattern2->nSize = 0;
      Gia_ManIncrementTravId(p->pAig);
      Cec_ManPatComputePattern2_rec(p->pAig,pObj + -(*(ulong *)pObj & 0x1fffffff),pMan->vPattern2);
      vPat = pMan->vPattern2;
      if (pMan->vPattern1->nSize < pMan->vPattern2->nSize) {
        vPat = pMan->vPattern1;
      }
      iVar7 = vPat->nSize;
      uVar3 = pMan->nPatLitsMin;
      uVar6 = pMan->nPatLitsMinAll;
      pMan->nPatLitsMin = iVar7 + uVar3;
      pMan->nPatLitsMinAll = iVar7 + uVar6;
      qsort(vPat->pArray,(long)iVar7,4,Vec_IntSortCompare1);
      Cec_ManPatStore(pMan,vPat);
      iVar7 = clock_gettime(3,&local_40);
      if (iVar7 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      pMan->timeTotal = pMan->timeTotal + lVar9 + lVar8;
      return;
    }
    __assert_fail("(Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                  ,0x174,"void Cec_ManPatSavePattern(Cec_ManPat_t *, Cec_ManSat_t *, Gia_Obj_t *)");
  }
  __assert_fail("Gia_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                ,0x16d,"void Cec_ManPatSavePattern(Cec_ManPat_t *, Cec_ManSat_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_ManPatSavePattern( Cec_ManPat_t * pMan, Cec_ManSat_t *  p, Gia_Obj_t * pObj )
{
    Vec_Int_t * vPat;
    int nPatLits;
    abctime clkTotal = Abc_Clock();
//    abctime clk;
    assert( Gia_ObjIsCo(pObj) );
    pMan->nPats++;
    pMan->nPatsAll++;
    // compute values in the cone of influence
//clk = Abc_Clock();
    Gia_ManIncrementTravId( p->pAig );
    nPatLits = Cec_ManPatComputePattern_rec( p, p->pAig, Gia_ObjFanin0(pObj) );
    assert( (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 1 );
    pMan->nPatLits += nPatLits;
    pMan->nPatLitsAll += nPatLits;
//pMan->timeFind += Abc_Clock() - clk;
    // compute sensitizing path
//clk = Abc_Clock();
    Vec_IntClear( pMan->vPattern1 );
    Gia_ManIncrementTravId( p->pAig );
    Cec_ManPatComputePattern1_rec( p->pAig, Gia_ObjFanin0(pObj), pMan->vPattern1 );
    // compute sensitizing path
    Vec_IntClear( pMan->vPattern2 );
    Gia_ManIncrementTravId( p->pAig );
    Cec_ManPatComputePattern2_rec( p->pAig, Gia_ObjFanin0(pObj), pMan->vPattern2 );
    // compare patterns
    vPat = Vec_IntSize(pMan->vPattern1) < Vec_IntSize(pMan->vPattern2) ? pMan->vPattern1 : pMan->vPattern2;
    pMan->nPatLitsMin += Vec_IntSize(vPat);
    pMan->nPatLitsMinAll += Vec_IntSize(vPat);
//pMan->timeShrink += Abc_Clock() - clk;
    // verify pattern using ternary simulation
//clk = Abc_Clock();
//    Cec_ManPatVerifyPattern( p->pAig, pObj, vPat );
//pMan->timeVerify += Abc_Clock() - clk;
    // sort pattern
//clk = Abc_Clock();
    Vec_IntSort( vPat, 0 );
//pMan->timeSort += Abc_Clock() - clk;
    // save pattern
    Cec_ManPatStore( pMan, vPat );
    pMan->timeTotal += Abc_Clock() - clkTotal;
}